

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# encode.cpp
# Opt level: O2

void duckdb_brotli::BrotliEncoderDestroyInstance(BrotliEncoderStateInternal *state)

{
  MemoryManager *m;
  void *pvVar1;
  MemoryManager *m_00;
  
  if (state != (BrotliEncoderStateInternal *)0x0) {
    m = &state->memory_manager_;
    BrotliFree(m,state->storage_);
    state->storage_ = (uint8_t *)0x0;
    BrotliFree(m,state->commands_);
    state->commands_ = (Command *)0x0;
    BrotliFree(m,(state->ringbuffer_).data_);
    (state->ringbuffer_).data_ = (uint8_t *)0x0;
    pvVar1 = (state->hasher_).common.extra[0];
    if (pvVar1 != (void *)0x0) {
      BrotliFree(m,pvVar1);
      (state->hasher_).common.extra[0] = (void *)0x0;
    }
    pvVar1 = (state->hasher_).common.extra[1];
    if (pvVar1 != (void *)0x0) {
      BrotliFree(m,pvVar1);
      (state->hasher_).common.extra[1] = (void *)0x0;
    }
    pvVar1 = (state->hasher_).common.extra[2];
    if (pvVar1 != (void *)0x0) {
      BrotliFree(m,pvVar1);
      (state->hasher_).common.extra[2] = (void *)0x0;
    }
    pvVar1 = (state->hasher_).common.extra[3];
    if (pvVar1 != (void *)0x0) {
      BrotliFree(m,pvVar1);
      (state->hasher_).common.extra[3] = (void *)0x0;
    }
    BrotliFree(m,state->large_table_);
    state->large_table_ = (int *)0x0;
    BrotliFree(m,state->one_pass_arena_);
    state->one_pass_arena_ = (BrotliOnePassArena *)0x0;
    BrotliFree(m,state->two_pass_arena_);
    state->two_pass_arena_ = (BrotliTwoPassArena *)0x0;
    BrotliFree(m,state->command_buf_);
    state->command_buf_ = (uint32_t *)0x0;
    BrotliFree(m,state->literal_buf_);
    state->literal_buf_ = (uint8_t *)0x0;
    BrotliCleanupSharedEncoderDictionary(m,&(state->params).dictionary);
    BrotliBootstrapFree((duckdb_brotli *)state,m,m_00);
    return;
  }
  return;
}

Assistant:

void duckdb_brotli::BrotliEncoderDestroyInstance(BrotliEncoderState* state) {
  if (!state) {
    return;
  } else {
    BrotliEncoderCleanupState(state);
    BrotliBootstrapFree(state, &state->memory_manager_);
  }
}